

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O1

void __thiscall QFont::detach(QFont *this)

{
  QFontPrivate *pQVar1;
  QFontEngineData *pQVar2;
  QFontPrivate *pQVar3;
  
  pQVar1 = (this->d).d.ptr;
  if ((__int_type)
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int> == 1) {
    pQVar2 = pQVar1->engineData;
    if (pQVar2 != (QFontEngineData *)0x0) {
      LOCK();
      (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)
            (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
            super___atomic_base<int> + -1);
      UNLOCK();
      if (((__int_type)
           (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int> == 0) &&
         (pQVar2 = ((this->d).d.ptr)->engineData, pQVar2 != (QFontEngineData *)0x0)) {
        QFontEngineData::~QFontEngineData(pQVar2);
        operator_delete(pQVar2,0x568);
      }
    }
    pQVar1 = (this->d).d.ptr;
    pQVar1->engineData = (QFontEngineData *)0x0;
    pQVar3 = pQVar1->scFont;
    if (pQVar3 != pQVar1 && pQVar3 != (QFontPrivate *)0x0) {
      LOCK();
      (pQVar3->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar3->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar3->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) &&
         (pQVar1 = ((this->d).d.ptr)->scFont, pQVar1 != (QFontPrivate *)0x0)) {
        QFontPrivate::~QFontPrivate(pQVar1);
        operator_delete(pQVar1,0x98);
      }
    }
    ((this->d).d.ptr)->scFont = (QFontPrivate *)0x0;
  }
  else if ((__int_type)
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int> != 1) {
    QExplicitlySharedDataPointer<QFontPrivate>::detach_helper(&this->d);
    return;
  }
  return;
}

Assistant:

void QFont::detach()
{
    if (d->ref.loadRelaxed() == 1) {
        if (d->engineData && !d->engineData->ref.deref())
            delete d->engineData;
        d->engineData = nullptr;
        if (d->scFont && d->scFont != d.data()) {
            if (!d->scFont->ref.deref())
                delete d->scFont;
        }
        d->scFont = nullptr;
        return;
    }

    d.detach();
}